

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true>::
SetProperty_Internal<false>
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance,PropertyId propertyId,Var value,PropertyOperationFlags flags,
          PropertyValueInfo *info)

{
  ScriptContext *pSVar1;
  ThreadContext *pTVar2;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  uint32 index;
  undefined4 *puVar7;
  undefined4 in_register_00000084;
  PropertyRecord *local_40;
  PropertyRecord *propertyRecord;
  
  propertyRecord = (PropertyRecord *)CONCAT44(in_register_00000084,flags);
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x4f9,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  local_40 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  pSVar1 = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015bbe90,IsConcatSpreadableCachePhase);
  if ((propertyId == 0x13) && (!bVar4)) {
    Output::Trace(IsConcatSpreadableCachePhase,L"IsConcatSpreadableCache invalidated\n");
    pTVar2 = pSVar1->threadContext;
    (pTVar2->isConcatSpreadableCache).type0 = (Type *)0x0;
    (pTVar2->isConcatSpreadableCache).type1 = (Type *)0x0;
  }
  if (local_40->isSymbol == false) {
    this_00 = (this->propertyMap).ptr;
    uVar5 = JsUtil::
            BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
            ::FindEntryWithKey<Js::PropertyRecord_const*>
                      ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                        *)this_00,&local_40);
    if (-1 < (int)uVar5) {
      BVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
              SetPropertyFromDescriptor<false,int>
                        ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>
                          *)this,instance,propertyId,propertyId,
                         (SimpleDictionaryPropertyDescriptor<unsigned_short> *)
                         ((this_00->entries).ptr + uVar5),value,
                         (PropertyOperationFlags)propertyRecord,info);
      return BVar6;
    }
  }
  if (local_40->isNumeric == true) {
    index = PropertyRecord::GetNumericValue(local_40);
    BVar6 = SetItem(this,instance,index,value,(PropertyOperationFlags)propertyRecord);
  }
  else {
    BVar6 = SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true>::
            AddProperty<Js::PropertyRecord_const*>
                      ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::JavascriptString*,true> *
                       )this,instance,local_40,value,'\a',info,
                       (PropertyOperationFlags)propertyRecord,SideEffects_Any);
  }
  return BVar6;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetProperty_Internal(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;

        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);

        JavascriptLibrary::CheckAndInvalidateIsConcatSpreadableCache(propertyId, instance->GetScriptContext());

        // It can be the case that propertyRecord is a symbol property and it has the same string description as
        // another property which is in the propertyMap. If we are in a string-keyed type handler, the propertyMap
        // will find that normal property when we call TryGetReference with the symbol propertyRecord. However,
        // we don't want to update that descriptor with value since the two properties are actually different.
        // In fact, we can't store a symbol in a string-keyed type handler at all since the string description
        // is not used for symbols. Instead, we want to skip searching for the descriptor if we are in a string-keyed
        // type handler. When we call AddProperty with the symbol propertyRecord, it should convert us to a
        // const PropertyRecord* - keyed type handler anyway.
        if (!(TMapKey_IsJavascriptString<TMapKey>() && propertyRecord->IsSymbol())
            && propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            return SetPropertyFromDescriptor<allowLetConstGlobal>(instance, propertyId, propertyId, descriptor, value, flags, info);
        }

        // Always check numeric propertyId. This may create objectArray.
        if (propertyRecord->IsNumeric())
        {
            return this->SetItem(instance, propertyRecord->GetNumericValue(), value, flags);
        }

        return this->AddProperty(instance, propertyRecord, value, PropertyDynamicTypeDefaults, info, flags, SideEffects_Any);
    }